

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

gravity_object_t * gravity_class_lookup(gravity_class_t *c,gravity_value_t key)

{
  gravity_value_t *pgVar1;
  
  while( true ) {
    if (c == (gravity_class_t *)0x0) {
      return (gravity_object_t *)0x0;
    }
    pgVar1 = gravity_hash_lookup(c->htable,key);
    if (pgVar1 != (gravity_value_t *)0x0) break;
    c = c->superclass;
  }
  return (gravity_object_t *)(pgVar1->field_1).n;
}

Assistant:

inline gravity_object_t *gravity_class_lookup (gravity_class_t *c, gravity_value_t key) {
    while (c) {
        gravity_value_t *v = gravity_hash_lookup(c->htable, key);
        if (v) return (gravity_object_t *)v->p;
        c = c->superclass;
    }
    return NULL;
}